

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_CustomBulletAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  AActor *pAVar6;
  AActor *proj;
  AActor *puff;
  AActor *origin;
  uint flags;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  double distance;
  void *pvVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  void *pvVar15;
  void *local_168;
  PClassActor *local_158;
  PClassActor *local_148;
  FName local_130;
  FName local_12c;
  void *local_128;
  undefined8 uStack_120;
  void *local_110;
  _func_int **local_108;
  void *local_100;
  AActor **local_f8;
  undefined8 uStack_f0;
  void *local_e8;
  void *pvStack_e0;
  double local_d8;
  ulong local_d0;
  DAngle local_c8;
  DAngle local_c0;
  DAngle local_b8;
  DAngle local_b0;
  DAngle local_a8;
  FSoundID local_9c;
  undefined1 local_98 [40];
  DThinker *pDStack_70;
  AActor *local_60;
  undefined1 local_58 [24];
  DAngle local_40;
  DAngle local_38;
  
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003dc6f4;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003dc6c5:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003dc6f4:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x64d,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  origin = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003dbfaa;
    bVar3 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003dc6f4;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003dc6c5;
LAB_003dbfaa:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar7 = "(paramnum) < numparam";
LAB_003dc71c:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x64e,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    pcVar7 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_003dc71c;
  }
  if ((uint)numparam < 3) {
    pcVar7 = "(paramnum) < numparam";
LAB_003dc744:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x64f,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar7 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_003dc744;
  }
  if (numparam == 3) {
    pcVar7 = "(paramnum) < numparam";
LAB_003dc76c:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x650,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar7 = "param[paramnum].Type == REGT_INT";
    goto LAB_003dc76c;
  }
  if ((uint)numparam < 5) {
    pcVar7 = "(paramnum) < numparam";
LAB_003dc794:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x651,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar7 = "param[paramnum].Type == REGT_INT";
    goto LAB_003dc794;
  }
  local_e8 = param[1].field_0.field_1.a;
  pvStack_e0 = (void *)0x0;
  local_128 = param[2].field_0.field_1.a;
  iVar9 = param[3].field_0.i;
  iVar1 = param[4].field_0.i;
  uStack_120 = 0;
  if (numparam == 5) {
    param = defaultparam->Array;
    if (param[5].field_0.field_3.Type != '\x03') {
LAB_003dc834:
      pcVar7 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003dc83b:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x652,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_158 = (PClassActor *)param[5].field_0.field_1.a;
    if (param[5].field_0.field_1.atag != 1) {
      if (local_158 != (PClassActor *)0x0) goto LAB_003dc834;
      local_158 = (PClassActor *)0x0;
    }
LAB_003dc0c3:
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dc863:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x653,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_168 = param[6].field_0.field_1.a;
LAB_003dc0d6:
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dc81c:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x654,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    flags = param[7].field_0.i;
LAB_003dc0e7:
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dc7fd:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x655,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar4 = param[8].field_0.i;
LAB_003dc0fe:
    if (param[9].field_0.field_3.Type != '\x03') {
LAB_003dc6ce:
      pcVar7 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003dc6d5:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x656,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_148 = (PClassActor *)param[9].field_0.field_1.a;
    if (param[9].field_0.field_1.atag != 1) {
      if (local_148 != (PClassActor *)0x0) goto LAB_003dc6ce;
      local_148 = (PClassActor *)0x0;
    }
LAB_003dc12b:
    if (param[10].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dc7de:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x657,
                    "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_110 = param[10].field_0.field_1.a;
  }
  else {
    if ((param[5].field_0.field_3.Type != '\x03') ||
       (local_158 = (PClassActor *)param[5].field_0.field_1.a,
       local_158 != (PClassActor *)0x0 && param[5].field_0.field_1.atag != 1)) {
      pcVar7 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003dc83b;
    }
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003dc0c3;
    }
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dc863;
    }
    local_168 = (void *)param[6].field_0.f;
    if (numparam == 7) {
      param = defaultparam->Array;
      goto LAB_003dc0d6;
    }
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dc81c;
    }
    flags = param[7].field_0.i;
    if ((uint)numparam < 9) {
      param = defaultparam->Array;
      goto LAB_003dc0e7;
    }
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dc7fd;
    }
    iVar4 = param[8].field_0.i;
    if (numparam == 9) {
      param = defaultparam->Array;
      goto LAB_003dc0fe;
    }
    if ((param[9].field_0.field_3.Type != '\x03') ||
       (local_148 = (PClassActor *)param[9].field_0.field_1.a,
       local_148 != (PClassActor *)0x0 && param[9].field_0.field_1.atag != 1)) {
      pcVar7 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003dc6d5;
    }
    if ((uint)numparam < 0xb) {
      param = defaultparam->Array;
      goto LAB_003dc12b;
    }
    if (param[10].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003dc7de;
    }
    local_110 = param[10].field_0.field_1.a;
    if (numparam != 0xb) {
      if (param[0xb].field_0.field_3.Type != '\x01') {
        pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
        goto LAB_003dc7bf;
      }
      goto LAB_003dc164;
    }
    param = defaultparam->Array;
  }
  if (param[0xb].field_0.field_3.Type != '\x01') {
    pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003dc7bf:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x658,
                  "int AF_AActor_A_CustomBulletAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003dc164:
  local_100 = param[0xb].field_0.field_1.a;
  pAVar6 = COPY_AAPTR(origin,iVar4);
  if ((pAVar6 != (AActor *)0x0) || ((flags & 1) != 0)) {
    local_f8 = (AActor **)(-(ulong)((double)local_168 == 0.0) & 0x40a0000000000000);
    if ((flags & 1) == 0) {
      local_38.Degrees = 0.0;
      local_40.Degrees = 270.0;
      local_58._16_8_ = 0.0;
      local_58._8_8_ = 0.0;
      uStack_f0 = 0;
      A_Face(origin,pAVar6,&local_38,&local_40,(DAngle *)(local_58 + 0x10),(DAngle *)(local_58 + 8),
             0,0.0);
    }
    distance = (double)(~-(ulong)((double)local_168 == 0.0) & (ulong)local_168 | (ulong)local_f8);
    local_f8 = (AActor **)(origin->Angles).Yaw.Degrees;
    local_108 = (_func_int **)0x0;
    if ((flags & 8) == 0) {
      local_60 = (AActor *)0x0;
      local_58._0_8_ = local_f8;
      P_AimLineAttack((AActor *)local_98,(DAngle *)origin,2048.0,
                      (FTranslatedLineTarget *)(local_98 + 0x40),(DAngle *)0x0,(int)local_98 + 0x38,
                      (AActor *)0x0,(AActor *)0x0);
      local_108 = (_func_int **)local_98._0_8_;
    }
    uVar8 = flags >> 3 & 2;
    if (local_158 == (PClassActor *)0x0) {
      local_158 = PClass::FindActor(NAME_BulletPuff);
    }
    local_9c.ID = (origin->AttackSound).super_FSoundID.ID;
    S_Sound(origin,1,&local_9c,1.0,1.0);
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    pvStack_e0 = local_128;
    local_d0 = (ulong)uVar8;
LAB_003dc347:
    bVar3 = iVar9 != 0;
    iVar9 = iVar9 + -1;
    if (bVar3) {
      pvVar10 = local_e8;
      pvVar15 = pvStack_e0;
      if ((flags & 4) == 0) {
        iVar4 = FRandom::Random2(&pr_cwbullet);
        iVar5 = FRandom::Random2(&pr_cwbullet);
        auVar14._0_8_ = (double)iVar4;
        auVar14._8_8_ = (double)iVar5;
        auVar14 = divpd(auVar14,_DAT_005b0220);
        pvVar10 = (void *)(auVar14._0_8_ * (double)local_e8);
        pvVar15 = (void *)(auVar14._8_8_ * (double)pvStack_e0);
      }
      iVar4 = iVar1;
      if ((flags & 2) == 0) {
        iVar4 = FRandom::operator()(&pr_cabullet);
        iVar4 = (iVar4 % 3 + 1) * iVar1;
      }
      local_128 = (void *)((double)local_f8 + (double)pvVar10);
      dVar11 = (double)pvVar15 + (double)local_108;
      local_12c.Index = 0xcd;
      local_b0.Degrees = dVar11;
      local_a8.Degrees = (double)local_128;
      pAVar6 = P_LineAttack(origin,&local_a8,distance,&local_b0,iVar4,&local_12c,local_158,
                            (int)local_d0,(FTranslatedLineTarget *)0x0,(int *)0x0);
      if (local_158 != (PClassActor *)0x0 && local_148 != (PClassActor *)0x0) {
        dVar12 = fastcosdeg((double)local_128);
        dVar12 = dVar12 * (double)local_100;
        dVar13 = fastsindeg((double)local_128);
        local_d8 = (origin->__Pos).Z;
        local_98._32_8_ = (origin->__Pos).X;
        pDStack_70 = (DThinker *)(origin->__Pos).Y;
        AActor::Vec3Offset((DVector3 *)local_98,origin,dVar12,dVar13 * (double)local_100,0.0,false);
        uVar2 = local_98._16_8_;
        (origin->__Pos).Z = (double)local_98._16_8_;
        (origin->__Pos).X = (double)local_98._0_8_;
        (origin->__Pos).Y = (double)local_98._8_8_;
        dVar12 = AActor::GetBobOffset(origin,0.0);
        local_b8.Degrees = (origin->Angles).Yaw.Degrees;
        proj = P_SpawnMissileAngleZSpeed
                         (origin,dVar12 + (double)uVar2 + (double)local_110,local_148,&local_b8,0.0,
                          *(double *)((local_148->super_PClass).Defaults + 0xe0),origin,false);
        (origin->__Pos).Z = local_d8;
        (origin->__Pos).X = (double)local_98._32_8_;
        (origin->__Pos).Y = (double)pDStack_70;
        if (proj != (AActor *)0x0) {
          puff = pAVar6;
          if (pAVar6 == (AActor *)0x0) {
            local_c0.Degrees = (double)local_128;
            local_130.Index = 0xcd;
            local_c8.Degrees = dVar11;
            puff = P_LineAttack(origin,&local_c0,distance,&local_c8,0,&local_130,local_158,uVar8 + 8
                                ,(FTranslatedLineTarget *)0x0,(int *)0x0);
            if (puff == (AActor *)0x0) goto LAB_003dc347;
          }
          AimBulletMissile(proj,puff,flags,pAVar6 == (AActor *)0x0,true);
        }
      }
      goto LAB_003dc347;
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomBulletAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE		(spread_xy);
	PARAM_ANGLE		(spread_z);
	PARAM_INT		(numbullets);
	PARAM_INT		(damageperbullet);
	PARAM_CLASS_DEF	(pufftype, AActor);
	PARAM_FLOAT_DEF	(range);
	PARAM_INT_DEF	(flags);
	PARAM_INT_DEF	(ptr);
	PARAM_CLASS_DEF (missile, AActor);
	PARAM_FLOAT_DEF (Spawnheight);
	PARAM_FLOAT_DEF (Spawnofs_xy);

	AActor *ref = COPY_AAPTR(self, ptr);

	if (range == 0)
		range = MISSILERANGE;

	int i;
	DAngle bangle;
	DAngle bslope = 0.;
	int laflags = (flags & CBAF_NORANDOMPUFFZ)? LAF_NORANDOMPUFFZ : 0;

	if (ref != NULL || (flags & CBAF_AIMFACING))
	{
		if (!(flags & CBAF_AIMFACING))
		{
			A_Face(self, ref);
		}
		bangle = self->Angles.Yaw;

		if (!(flags & CBAF_NOPITCH)) bslope = P_AimLineAttack (self, bangle, MISSILERANGE);
		if (pufftype == nullptr) pufftype = PClass::FindActor(NAME_BulletPuff);

		S_Sound (self, CHAN_WEAPON, self->AttackSound, 1, ATTN_NORM);
		for (i = 0; i < numbullets; i++)
		{
			DAngle angle = bangle;
			DAngle slope = bslope;

			if (flags & CBAF_EXPLICITANGLE)
			{
				angle += spread_xy;
				slope += spread_z;
			}
			else
			{
				angle += spread_xy * (pr_cwbullet.Random2() / 255.);
				slope += spread_z * (pr_cwbullet.Random2() / 255.);
			}

			int damage = damageperbullet;

			if (!(flags & CBAF_NORANDOM))
				damage *= ((pr_cabullet()%3)+1);

			AActor *puff = P_LineAttack(self, angle, range, slope, damage, NAME_Hitscan, pufftype, laflags);
			if (missile != nullptr && pufftype != nullptr)
			{
				double x = Spawnofs_xy * angle.Cos();
				double y = Spawnofs_xy * angle.Sin();
				
				DVector3 pos = self->Pos();
				self->SetXYZ(self->Vec3Offset(x, y, 0.));
				AActor *proj = P_SpawnMissileAngleZSpeed(self, self->Z() + self->GetBobOffset() + Spawnheight, missile, self->Angles.Yaw, 0, GetDefaultByType(missile)->Speed, self, false);
				self->SetXYZ(pos);
				
				if (proj)
				{
					bool temp = (puff == nullptr);
					if (!puff)
					{
						puff = P_LineAttack(self, angle, range, slope, 0, NAME_Hitscan, pufftype, laflags | LAF_NOINTERACT);
					}
					if (puff)
					{			
						AimBulletMissile(proj, puff, flags, temp, true);
					}
				}
			}
		}
    }
	return 0;
}